

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O3

string * gmlc::networking::generateMatchingInterfaceAddress
                   (string *__return_storage_ptr__,string *server,InterfaceNetworks network)

{
  char *__s;
  size_type __len2;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(network >> 1 | network << 7) {
  case LOCAL:
    if (server->_M_string_length != 0) {
      getLocalExternalAddress(&sStack_38,server);
      generateMatchingInterfaceAddress();
      return __return_storage_ptr__;
    }
    __len2 = 0xf;
    __s = "tcp://127.0.0.1";
    goto LAB_004130e4;
  default:
    goto switchD_00413080_caseD_1;
  case 2:
    if (server->_M_string_length != 0) {
      getLocalExternalAddressV4(&sStack_38,server);
      generateMatchingInterfaceAddress();
      return __return_storage_ptr__;
    }
    break;
  case 3:
    if (server->_M_string_length != 0) {
      getLocalExternalAddressV6(&sStack_38,server);
      generateMatchingInterfaceAddress();
      return __return_storage_ptr__;
    }
    break;
  case 5:
    if (server->_M_string_length != 0) {
      getLocalExternalAddress(&sStack_38,server);
      generateMatchingInterfaceAddress();
      return __return_storage_ptr__;
    }
  }
  __len2 = 7;
  __s = "tcp://*";
LAB_004130e4:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,0,0,__s,__len2);
switchD_00413080_caseD_1:
  return __return_storage_ptr__;
}

Assistant:

std::string generateMatchingInterfaceAddress(
    const std::string& server,
    InterfaceNetworks network)
{
    std::string newInterface;
    switch (network) {
        case InterfaceNetworks::LOCAL:
            if (server.empty()) {
                newInterface = "tcp://127.0.0.1";
            } else {
                newInterface = getLocalExternalAddress(server);
            }
            break;
        case InterfaceNetworks::IPV4:
            if (server.empty()) {
                newInterface = "tcp://*";
            } else {
                newInterface = getLocalExternalAddressV4(server);
            }
            break;
        case InterfaceNetworks::IPV6:
            if (server.empty()) {
                newInterface = "tcp://*";
            } else {
                newInterface = getLocalExternalAddressV6(server);
            }
            break;
        case InterfaceNetworks::ALL:
            if (server.empty()) {
                newInterface = "tcp://*";
            } else {
                newInterface = getLocalExternalAddress(server);
            }
            break;
    }
    return newInterface;
}